

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_kiss.cpp
# Opt level: O0

void __thiscall
ear::WorkBufKiss<float>::WorkBufKiss
          (WorkBufKiss<float> *this,size_t n_fft,kissfft<float> *plan_forward,
          kissfft<float> *plan_reverse)

{
  kissfft<float> *pkVar1;
  allocator<std::complex<float>_> local_36;
  allocator<std::complex<float>_> local_35 [13];
  kissfft<float> *local_28;
  kissfft<float> *plan_reverse_local;
  kissfft<float> *plan_forward_local;
  size_t n_fft_local;
  WorkBufKiss<float> *this_local;
  
  local_28 = plan_reverse;
  plan_reverse_local = plan_forward;
  plan_forward_local = (kissfft<float> *)n_fft;
  n_fft_local = (size_t)this;
  FFTWorkBuf::FFTWorkBuf(&this->super_FFTWorkBuf);
  (this->super_FFTWorkBuf)._vptr_FFTWorkBuf = (_func_int **)&PTR__WorkBufKiss_00286a20;
  kissfft<float>::kissfft(&this->plan_forward,plan_forward);
  kissfft<float>::kissfft(&this->plan_reverse,plan_reverse);
  pkVar1 = plan_forward_local;
  std::allocator<std::complex<float>_>::allocator(local_35);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&this->reverse_tmp_input,(size_type)pkVar1,local_35);
  std::allocator<std::complex<float>_>::~allocator(local_35);
  pkVar1 = plan_forward_local;
  std::allocator<std::complex<float>_>::allocator(&local_36);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&this->reverse_tmp_output,(size_type)pkVar1,&local_36);
  std::allocator<std::complex<float>_>::~allocator(&local_36);
  return;
}

Assistant:

WorkBufKiss(size_t n_fft, kissfft<Real> plan_forward,
                kissfft<Real> plan_reverse)
        : plan_forward(plan_forward),
          plan_reverse(plan_reverse),
          reverse_tmp_input(n_fft),
          reverse_tmp_output(n_fft) {}